

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O2

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CAssignSubscriptStm *stm)

{
  initializer_list<INode_*> __l;
  allocator_type local_a9;
  _Vector_base<INode_*,_std::allocator<INode_*>_> local_a8;
  string local_90;
  vector<INode_*,_std::allocator<INode_*>_> children;
  _Head_base<0UL,_CIdExp_*,_false> local_58;
  IExpression *pIStack_50;
  IExpression *local_48;
  ChildrenAnswers local_40;
  
  local_58._M_head_impl =
       (stm->idExpression)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
       super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
       super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  pIStack_50 = (stm->indexExpression)._M_t.
               super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
               super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
               super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  local_48 = (stm->valueExpression)._M_t.
             super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
             super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
             super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_58;
  std::vector<INode_*,_std::allocator<INode_*>_>::vector(&children,__l,&local_a9);
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)&local_a8,&children);
  VisitChildren(&local_40,this,(vector<INode_*,_std::allocator<INode_*>_> *)&local_a8);
  AddChildrenAnswers(this,&local_40);
  ChildrenAnswers::~ChildrenAnswers((ChildrenAnswers *)&local_40);
  std::_Vector_base<INode_*,_std::allocator<INode_*>_>::~_Vector_base(&local_a8);
  std::__cxx11::string::string((string *)&local_90,"AssignSubscriptStm",(allocator *)&local_58);
  AddLabel(this,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  this->lastVisited = this->lastVisited + 1;
  std::_Vector_base<INode_*,_std::allocator<INode_*>_>::~_Vector_base
            (&children.super__Vector_base<INode_*,_std::allocator<INode_*>_>);
  return;
}

Assistant:

void CPrintVisitor::Visit(CAssignSubscriptStm &stm) {
	std::vector<INode*> children = { stm.idExpression.get(), stm.indexExpression.get(), stm.valueExpression.get() };
	AddChildrenAnswers(VisitChildren(children));
	AddLabel("AssignSubscriptStm");
	++lastVisited;
}